

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_23::lambda_variable_arity_while_using_rest_arg::
~lambda_variable_arity_while_using_rest_arg(lambda_variable_arity_while_using_rest_arg *this)

{
  lambda_variable_arity_while_using_rest_arg *this_local;
  
  ~lambda_variable_arity_while_using_rest_arg(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      TEST_EQ("()", run("(let([f(lambda args args)]) (f)) "));
      TEST_EQ("(10)", run("(let([f(lambda args args)]) (f 10)) "));
      TEST_EQ("(10 20)", run("(let([f(lambda args args)]) (f 10 20)) "));
      TEST_EQ("(10 20 30)", run("(let([f(lambda args args)]) (f 10 20 30)) "));
      TEST_EQ("(10 20 30 40)", run("(let([f(lambda args args)]) (f 10 20 30 40)) "));
      TEST_EQ("(10 20 30 40 50)", run("(let([f(lambda args args)]) (f 10 20 30 40 50)) "));
      TEST_EQ("(10 20 30 40 50 60)", run("(let([f(lambda args args)]) (f 10 20 30 40 50 60)) "));
      TEST_EQ("(10 20 30 40 50 60 70)", run("(let([f(lambda args args)]) (f 10 20 30 40 50 60 70)) "));
      TEST_EQ("#(10 ())", run("(let([f(lambda(a0 . args) (vector a0 args))]) (f 10)) "));
      TEST_EQ("#(10 (20))", run("(let([f(lambda(a0 . args) (vector a0 args))]) (f 10 20)) "));
      TEST_EQ("#(10 (20 30))", run("(let([f(lambda(a0 . args) (vector a0 args))]) (f 10 20 30)) "));
      TEST_EQ("#(10 (20 30 40))", run("(let([f(lambda(a0 . args) (vector a0 args))]) (f 10 20 30 40)) "));
      TEST_EQ("#(10 20 (30 40 50 60 70 80 90))", run("(let([f(lambda(a0 a1 . args) (vector a0 a1 args))]) (f 10 20 30 40 50 60 70 80 90)) "));
      TEST_EQ("#(10 20 30 (40 50 60 70 80 90))", run("(let([f(lambda(a0 a1 a2 . args) (vector a0 a1 a2 args))]) (f 10 20 30 40 50 60 70 80 90)) "));
      TEST_EQ("#(10 20 30 40 (50 60 70 80 90))", run("(let([f(lambda(a0 a1 a2 a3 . args) (vector a0 a1 a2 a3 args))]) (f 10 20 30 40 50 60 70 80 90)) "));
      TEST_EQ("#(10 20 30 40 50 (60 70 80 90))", run("(let([f(lambda(a0 a1 a2 a3 a4 . args) (vector a0 a1 a2 a3 a4 args))]) (f 10 20 30 40 50 60 70 80 90)) "));
      TEST_EQ("#(10 20 30 40 50 60 (70 80 90))", run("(let([f(lambda(a0 a1 a2 a3 a4 a5 . args)(vector a0 a1 a2 a3 a4 a5 args))]) (f 10 20 30 40 50 60 70 80 90)) "));
      TEST_EQ("#(10 20 30 40 50 60 70 (80 90))", run("(let([f(lambda(a0 a1 a2 a3 a4 a5 a6 . args)(vector a0 a1 a2 a3 a4 a5 a6 args))]) (f 10 20 30 40 50 60 70 80 90)) "));
      TEST_EQ("#(10 20 30 40 50 60 70 80 (90))", run("(let([f(lambda(a0 a1 a2 a3 a4 a5 a6 a7 . args)(vector a0 a1 a2 a3 a4 a5 a6 a7 args))]) (f 10 20 30 40 50 60 70 80 90)) "));
      }